

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptor
          (Generator *this,FieldDescriptor *field,bool is_extension)

{
  bool bVar1;
  string *psVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  Generator *this_00;
  mapped_type *__k;
  byte in_DL;
  int __c;
  FieldDescriptor *in_RSI;
  char field_descriptor_decl [409];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string options_string;
  undefined4 in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  AlphaNum *in_stack_fffffffffffff880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  FieldDescriptor *in_stack_fffffffffffff890;
  allocator *paVar5;
  AlphaNum *in_stack_fffffffffffff8b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined1 local_608 [104];
  char *in_stack_fffffffffffffa60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa68;
  Printer *in_stack_fffffffffffffa70;
  FieldDescriptor *in_stack_fffffffffffffb68;
  allocator local_469;
  string local_468 [37];
  byte local_443;
  allocator local_442;
  byte local_441;
  string local_440 [32];
  string local_420 [39];
  undefined1 local_3f9 [33];
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  undefined1 local_389 [33];
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [80];
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [80];
  string local_250 [39];
  allocator local_229;
  string local_228 [80];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [80];
  string local_160 [39];
  allocator local_139;
  string local_138 [80];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [96];
  string local_38 [39];
  byte local_11;
  FieldDescriptor *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  FieldDescriptor::options(local_10);
  MessageLite::SerializeToString
            ((MessageLite *)in_stack_fffffffffffff880,
             (string *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4bddba);
  psVar2 = FieldDescriptor::name_abi_cxx11_(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"name",&local_99);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)psVar2);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  psVar2 = FieldDescriptor::full_name_abi_cxx11_(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"full_name",&local_c1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)psVar2);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  FieldDescriptor::index(local_10,(char *)psVar2,__c);
  strings::AlphaNum::AlphaNum(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  StrCat_abi_cxx11_(in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"index",&local_139);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,local_e8);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_e8);
  FieldDescriptor::number(local_10);
  strings::AlphaNum::AlphaNum(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  StrCat_abi_cxx11_(in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"number",&local_1b1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,local_160);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_160);
  FieldDescriptor::type(in_stack_fffffffffffff890);
  strings::AlphaNum::AlphaNum(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  StrCat_abi_cxx11_(in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"type",&local_229);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,local_1d8);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_1d8);
  FieldDescriptor::cpp_type((FieldDescriptor *)0x4be186);
  strings::AlphaNum::AlphaNum(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  StrCat_abi_cxx11_(in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"cpp_type",&local_2a1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,local_250);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_250);
  FieldDescriptor::label(local_10);
  strings::AlphaNum::AlphaNum(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  StrCat_abi_cxx11_(in_stack_fffffffffffff8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"label",&local_319);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,local_2c8);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2c8);
  bVar1 = FieldDescriptor::has_default_value(local_10);
  pcVar4 = "False";
  if (bVar1) {
    pcVar4 = "True";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"has_default_value",&local_341);
  this_00 = (Generator *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)this_00,pcVar4);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  (anonymous_namespace)::StringifyDefaultValue_abi_cxx11_(in_stack_fffffffffffffb68);
  psVar2 = (string *)local_389;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_389 + 1),"default_value",(allocator *)psVar2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,local_368);
  std::__cxx11::string::~string((string *)(local_389 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_389);
  std::__cxx11::string::~string(local_368);
  pcVar4 = "False";
  if ((local_11 & 1) != 0) {
    pcVar4 = "True";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"is_extension",&local_3b1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff8c0,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)pmVar3,pcVar4);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  OptionsValue(this_00,psVar2);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_3f9 + 1),"serialized_options",(allocator *)__rhs);
  __k = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)__rhs,(key_type *)in_stack_fffffffffffff8b8);
  std::__cxx11::string::operator=((string *)__k,local_3d8);
  std::__cxx11::string::~string((string *)(local_3f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3f9);
  std::__cxx11::string::~string(local_3d8);
  local_441 = 0;
  local_443 = 0;
  bVar1 = FieldDescriptor::has_json_name(local_10);
  if (bVar1) {
    FieldDescriptor::json_name_abi_cxx11_(local_10);
    std::operator+((char *)pmVar3,__rhs);
    local_441 = 1;
    std::operator+(in_stack_fffffffffffff888,(char *)in_stack_fffffffffffff880);
  }
  else {
    std::allocator<char>::allocator();
    local_443 = 1;
    std::__cxx11::string::string(local_420,"",&local_442);
  }
  paVar5 = &local_469;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"json_name",paVar5);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)__rhs,__k);
  std::__cxx11::string::operator=((string *)pmVar3,local_420);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::__cxx11::string::~string(local_420);
  if ((local_443 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_442);
  }
  if ((local_441 & 1) != 0) {
    std::__cxx11::string::~string(local_440);
  }
  memcpy(local_608,
         "_descriptor.FieldDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\', index=$index$,\n  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n  has_default_value=$has_default_value$, default_value=$default_value$,\n  message_type=None, enum_type=None, containing_type=None,\n  is_extension=$is_extension$, extension_scope=None,\n  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR)"
         ,0x199);
  io::Printer::Print(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4be775);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Generator::PrintFieldDescriptor(const FieldDescriptor& field,
                                     bool is_extension) const {
  std::string options_string;
  field.options().SerializeToString(&options_string);
  std::map<std::string, std::string> m;
  m["name"] = field.name();
  m["full_name"] = field.full_name();
  m["index"] = StrCat(field.index());
  m["number"] = StrCat(field.number());
  m["type"] = StrCat(field.type());
  m["cpp_type"] = StrCat(field.cpp_type());
  m["label"] = StrCat(field.label());
  m["has_default_value"] = field.has_default_value() ? "True" : "False";
  m["default_value"] = StringifyDefaultValue(field);
  m["is_extension"] = is_extension ? "True" : "False";
  m["serialized_options"] = OptionsValue(options_string);
  m["json_name"] =
      field.has_json_name() ? ", json_name='" + field.json_name() + "'" : "";
  // We always set message_type and enum_type to None at this point, and then
  // these fields in correctly after all referenced descriptors have been
  // defined and/or imported (see FixForeignFieldsInDescriptors()).
  const char field_descriptor_decl[] =
      "_descriptor.FieldDescriptor(\n"
      "  name='$name$', full_name='$full_name$', index=$index$,\n"
      "  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n"
      "  has_default_value=$has_default_value$, "
      "default_value=$default_value$,\n"
      "  message_type=None, enum_type=None, containing_type=None,\n"
      "  is_extension=$is_extension$, extension_scope=None,\n"
      "  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR)";
  printer_->Print(m, field_descriptor_decl);
}